

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GTestPluginManager.cpp
# Opt level: O2

void __thiscall
TestPluginManagerPathResolution_FallsbackOnDefault_Config_Test::TestBody
          (TestPluginManagerPathResolution_FallsbackOnDefault_Config_Test *this)

{
  bool bVar1;
  long lVar2;
  char *in_R9;
  AssertHelper local_180;
  __uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_178;
  path local_170 [2];
  AssertionResult gtest_ar_;
  string configFile;
  string local_f0;
  string local_d0;
  path resolvedPath;
  path configPath;
  path resolvedPathCombined;
  path expectedDefaultPath;
  
  unsetenv("PLUGIN_CONFIG_PATH");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&configFile,"pluginlist.pb.txt",(allocator<char> *)local_170);
  plugin::detail::GetApplicationPath_abi_cxx11_();
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (local_170,&configFile,auto_format);
  std::filesystem::__cxx11::operator/(&configPath,&expectedDefaultPath,local_170);
  std::filesystem::__cxx11::path::~path(local_170);
  std::__cxx11::string::string((string *)&local_d0,(string *)&configFile);
  plugin::PluginManager::ResolveConfigPath(&resolvedPath,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  plugin::detail::GetApplicationPath_abi_cxx11_();
  std::filesystem::__cxx11::operator/(&resolvedPathCombined,local_170,&resolvedPath);
  std::filesystem::__cxx11::path::~path(local_170);
  std::filesystem::__cxx11::path::path(local_170,&resolvedPath);
  std::filesystem::__cxx11::path::path(local_170 + 1,&resolvedPathCombined);
  bVar1 = std::filesystem::__cxx11::operator==(local_170,&configPath);
  if (!bVar1) {
    bVar1 = std::filesystem::__cxx11::operator==(local_170 + 1,&configPath);
    if (!bVar1) {
      gtest_ar_.success_ = false;
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      testing::Message::Message((Message *)&local_178);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_f0,(internal *)&gtest_ar_,
                 (AssertionResult *)"IsIn(configPath, expectedPaths)","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_180,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/bidachon[P]PluginManager/Test/GTestPluginManager.cpp"
                 ,0xef,local_f0._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_180,(Message *)&local_178);
      testing::internal::AssertHelper::~AssertHelper(&local_180);
      std::__cxx11::string::~string((string *)&local_f0);
      if (local_178._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl !=
          (_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        (**(code **)(*(long *)local_178._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl + 8))();
      }
      goto LAB_0011d709;
    }
  }
  gtest_ar_.success_ = true;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
LAB_0011d709:
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  lVar2 = 0x28;
  do {
    std::filesystem::__cxx11::path::~path
              ((path *)((long)&local_170[0]._M_pathname._M_dataplus._M_p + lVar2));
    lVar2 = lVar2 + -0x28;
  } while (lVar2 != -0x28);
  std::filesystem::__cxx11::path::~path(&resolvedPathCombined);
  std::filesystem::__cxx11::path::~path(&resolvedPath);
  std::filesystem::__cxx11::path::~path(&configPath);
  std::filesystem::__cxx11::path::~path(&expectedDefaultPath);
  std::__cxx11::string::~string((string *)&configFile);
  return;
}

Assistant:

TEST(TestPluginManagerPathResolution, FallsbackOnDefault_Config)
{
    unsetenv("PLUGIN_CONFIG_PATH");
    std::string const configFile{"pluginlist.pb.txt"};
    auto const expectedDefaultPath = plugin::detail::GetApplicationPath();
    auto const configPath = expectedDefaultPath / configFile;

    auto const resolvedPath = plugin::PluginManager::ResolveConfigPath(configFile);
    auto const resolvedPathCombined = plugin::detail::GetApplicationPath() / resolvedPath;

    auto const expectedPaths = {resolvedPath, resolvedPathCombined};
    EXPECT_TRUE(IsIn(configPath, expectedPaths));
}